

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Mul::innerExtrema
          (Interval *__return_storage_ptr__,Mul *this,EvalContext *param_1,Interval *xi,Interval *yi
          )

{
  Interval *pIVar1;
  bool bVar2;
  float fVar3;
  bool local_f1;
  bool local_d9;
  Interval local_b8;
  Interval local_a0;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  Interval local_40;
  Interval *local_28;
  Interval *yi_local;
  Interval *xi_local;
  EvalContext *param_1_local;
  Mul *this_local;
  
  local_28 = yi;
  yi_local = xi;
  xi_local = (Interval *)param_1;
  param_1_local = (EvalContext *)this;
  fVar3 = std::numeric_limits<float>::infinity();
  tcu::Interval::Interval(&local_40,(double)-fVar3);
  bVar2 = tcu::Interval::contains(xi,&local_40);
  pIVar1 = yi_local;
  if (bVar2) {
LAB_024ae6ca:
    pIVar1 = local_28;
    tcu::Interval::Interval(&local_70,0.0);
    bVar2 = tcu::Interval::contains(pIVar1,&local_70);
    local_d9 = true;
    if (bVar2) goto LAB_024ae7c5;
  }
  else {
    fVar3 = std::numeric_limits<float>::infinity();
    tcu::Interval::Interval(&local_58,(double)fVar3);
    bVar2 = tcu::Interval::contains(pIVar1,&local_58);
    if (bVar2) goto LAB_024ae6ca;
  }
  pIVar1 = local_28;
  fVar3 = std::numeric_limits<float>::infinity();
  tcu::Interval::Interval(&local_88,(double)-fVar3);
  bVar2 = tcu::Interval::contains(pIVar1,&local_88);
  pIVar1 = local_28;
  if (bVar2) {
LAB_024ae786:
    pIVar1 = yi_local;
    tcu::Interval::Interval(&local_b8,0.0);
    local_f1 = tcu::Interval::contains(pIVar1,&local_b8);
  }
  else {
    fVar3 = std::numeric_limits<float>::infinity();
    tcu::Interval::Interval(&local_a0,(double)fVar3);
    bVar2 = tcu::Interval::contains(pIVar1,&local_a0);
    local_f1 = false;
    if (bVar2) goto LAB_024ae786;
  }
  local_d9 = local_f1;
LAB_024ae7c5:
  if (local_d9 == false) {
    tcu::Interval::Interval(__return_storage_ptr__);
  }
  else {
    fVar3 = std::numeric_limits<float>::quiet_NaN();
    tcu::Interval::Interval(__return_storage_ptr__,(double)fVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	innerExtrema(const EvalContext&, const Interval& xi, const Interval& yi) const
	{
		if (((xi.contains(-TCU_INFINITY) || xi.contains(TCU_INFINITY)) && yi.contains(0.0)) ||
			((yi.contains(-TCU_INFINITY) || yi.contains(TCU_INFINITY)) && xi.contains(0.0)))
			return Interval(TCU_NAN);

		return Interval();
	}